

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintExpressionContents::visitArrayGet(PrintExpressionContents *this,ArrayGet *curr)

{
  HeapType type;
  char *pcVar1;
  ostream *o;
  string_view str;
  size_t sStack_40;
  HeapType local_38;
  int local_30;
  uintptr_t local_28;
  
  local_28 = (uintptr_t)wasm::Type::getHeapType(&curr->ref->type);
  HeapType::getArray(&local_38);
  if ((local_38.id == 2) && (local_30 != 0)) {
    o = this->o;
    if (curr->signed_ == true) {
      pcVar1 = "array.get_s ";
    }
    else {
      pcVar1 = "array.get_u ";
    }
    sStack_40 = 0xc;
  }
  else {
    o = this->o;
    pcVar1 = "array.get ";
    sStack_40 = 10;
  }
  str._M_str = pcVar1;
  str._M_len = sStack_40;
  printMedium(o,str);
  type = wasm::Type::getHeapType(&curr->ref->type);
  printHeapTypeName(this,type);
  return;
}

Assistant:

void visitArrayGet(ArrayGet* curr) {
    const auto& element = curr->ref->type.getHeapType().getArray().element;
    if (element.type == Type::i32 && element.packedType != Field::not_packed) {
      if (curr->signed_) {
        printMedium(o, "array.get_s ");
      } else {
        printMedium(o, "array.get_u ");
      }
    } else {
      printMedium(o, "array.get ");
    }
    printHeapTypeName(curr->ref->type.getHeapType());
  }